

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ReleaseExtensionMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ReleaseExtensionMessageTest_Test *this)

{
  Metadata MVar1;
  TestAllExtensions message;
  ReflectionTester reflection_tester;
  TestAllExtensions TStack_b8;
  ReflectionTester local_88;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&TStack_b8,(Arena *)0x0);
  MVar1 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  TestUtil::ReflectionTester::ReflectionTester(&local_88,MVar1.descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&local_88,&TStack_b8.super_Message,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_88,&TStack_b8.super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&local_88,&TStack_b8.super_Message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_88,&TStack_b8.super_Message);
  proto2_unittest::TestAllExtensions::Clear(&TStack_b8);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&local_88,&TStack_b8.super_Message,CAN_BE_NULL);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&TStack_b8);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&TStack_b8);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&TStack_b8);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ReleaseExtensionMessageTest) {
  unittest::TestAllExtensions message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllExtensions::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(&message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(&message);
  message.Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      &message, TestUtil::ReflectionTester::CAN_BE_NULL);

  // Test a different code path for setting after releasing.
  TestUtil::SetAllExtensions(&message);
  TestUtil::ExpectAllExtensionsSet(message);
}